

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::anon_unknown_19::ValidateMergedFeatures
          (anon_unknown_19 *this,FeatureSet *features)

{
  bool bVar1;
  undefined7 extraout_var;
  Status SVar2;
  char *args;
  
  bVar1 = FeatureSet_FieldPresence_IsValid((features->field_0)._impl_.field_presence_);
  if ((bVar1) && ((features->field_0)._impl_.field_presence_ != 0)) {
    bVar1 = FeatureSet_EnumType_IsValid((features->field_0)._impl_.enum_type_);
    if ((bVar1) && ((features->field_0)._impl_.enum_type_ != 0)) {
      bVar1 = FeatureSet_RepeatedFieldEncoding_IsValid
                        ((features->field_0)._impl_.repeated_field_encoding_);
      if ((bVar1) && ((features->field_0)._impl_.repeated_field_encoding_ != 0)) {
        bVar1 = FeatureSet_Utf8Validation_IsValid((features->field_0)._impl_.utf8_validation_);
        if ((bVar1) && ((features->field_0)._impl_.utf8_validation_ != 0)) {
          bVar1 = FeatureSet_MessageEncoding_IsValid((features->field_0)._impl_.message_encoding_);
          if ((bVar1) && ((features->field_0)._impl_.message_encoding_ != 0)) {
            SVar2.rep_._0_1_ =
                 FeatureSet_JsonFormat_IsValid((features->field_0)._impl_.json_format_);
            SVar2.rep_._1_7_ = extraout_var;
            if ((SVar2.rep_._0_1_) && ((features->field_0)._impl_.json_format_ != 0)) {
              *(undefined8 *)this = 1;
              return (Status)SVar2.rep_;
            }
            args = 
            "Feature field `json_format` must resolve to a known value, found JSON_FORMAT_UNKNOWN";
          }
          else {
            args = 
            "Feature field `message_encoding` must resolve to a known value, found MESSAGE_ENCODING_UNKNOWN"
            ;
          }
        }
        else {
          args = 
          "Feature field `utf8_validation` must resolve to a known value, found UTF8_VALIDATION_UNKNOWN"
          ;
        }
      }
      else {
        args = 
        "Feature field `repeated_field_encoding` must resolve to a known value, found REPEATED_FIELD_ENCODING_UNKNOWN"
        ;
      }
    }
    else {
      args = "Feature field `enum_type` must resolve to a known value, found ENUM_TYPE_UNKNOWN";
    }
  }
  else {
    args = 
    "Feature field `field_presence` must resolve to a known value, found FIELD_PRESENCE_UNKNOWN";
  }
  SVar2 = (anonymous_namespace)::Error<char_const*>((_anonymous_namespace_ *)this,args);
  return (Status)SVar2.rep_;
}

Assistant:

absl::Status ValidateMergedFeatures(const FeatureSet& features) {
// Avoid using reflection here because this is called early in the descriptor
// builds.  Instead, a reflection-based test will be used to keep this in sync
// with descriptor.proto.  These checks should be run on every global feature
// in FeatureSet.
#define CHECK_ENUM_FEATURE(FIELD, CAMELCASE, UPPERCASE)               \
  if (!FeatureSet::CAMELCASE##_IsValid(features.FIELD()) ||           \
      features.FIELD() == FeatureSet::UPPERCASE##_UNKNOWN) {          \
    return Error("Feature field `" #FIELD                             \
                 "` must resolve to a known value, found " #UPPERCASE \
                 "_UNKNOWN");                                         \
  }

  CHECK_ENUM_FEATURE(field_presence, FieldPresence, FIELD_PRESENCE)
  CHECK_ENUM_FEATURE(enum_type, EnumType, ENUM_TYPE)
  CHECK_ENUM_FEATURE(repeated_field_encoding, RepeatedFieldEncoding,
                     REPEATED_FIELD_ENCODING)
  CHECK_ENUM_FEATURE(utf8_validation, Utf8Validation, UTF8_VALIDATION)
  CHECK_ENUM_FEATURE(message_encoding, MessageEncoding, MESSAGE_ENCODING)
  CHECK_ENUM_FEATURE(json_format, JsonFormat, JSON_FORMAT)

#undef CHECK_ENUM_FEATURE

  return absl::OkStatus();
}